

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void vector_print(FILE *fp,vector_t v,int32 dim)

{
  int local_20;
  int32 i;
  int32 dim_local;
  vector_t v_local;
  FILE *fp_local;
  
  for (local_20 = 0; local_20 < dim; local_20 = local_20 + 1) {
    fprintf((FILE *)fp," %11.4e",(double)(float)v[local_20]);
  }
  fprintf((FILE *)fp,"\n");
  fflush((FILE *)fp);
  return;
}

Assistant:

void
vector_print(FILE * fp, vector_t v, int32 dim)
{
    int32 i;

    for (i = 0; i < dim; i++)
        fprintf(fp, " %11.4e", v[i]);
    fprintf(fp, "\n");
    fflush(fp);
}